

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O0

int __thiscall efsw::DirectorySnapshot::init(DirectorySnapshot *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  string local_38 [32];
  EVP_PKEY_CTX *local_18;
  string *directory_local;
  DirectorySnapshot *this_local;
  
  local_18 = ctx;
  directory_local = (string *)this;
  std::__cxx11::string::string(local_38,(string *)ctx);
  setDirectoryInfo(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  initFiles(this);
  return extraout_EAX;
}

Assistant:

void DirectorySnapshot::init( std::string directory ) {
	setDirectoryInfo( directory );
	initFiles();
}